

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::return_reward_from_node
                (memory_tree *b,single_learner *base,uint32_t cn,example *ec,float weight)

{
  long lVar1;
  label_t lVar2;
  node *pnVar3;
  example *ec1;
  example **ppeVar4;
  example *in_RCX;
  uint in_EDX;
  memory_tree *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  float fVar5;
  float score;
  float reward;
  int64_t closest_ec;
  float prediction;
  labels preds;
  labels multilabels;
  uint32_t save_multi_pred;
  label_t mc;
  size_t in_stack_ffffffffffffff30;
  example *in_stack_ffffffffffffff38;
  example *ec_00;
  example *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  memory_tree *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float fVar6;
  float in_stack_ffffffffffffff80;
  undefined4 uVar7;
  uint32_t cn_00;
  action_score *in_stack_ffffffffffffff90;
  memory_tree *in_stack_ffffffffffffff98;
  float *local_60;
  size_t local_58;
  label_t local_50;
  wclass *local_48;
  wclass *local_40;
  example *in_stack_ffffffffffffffc8;
  float local_30;
  uint32_t in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  example *peVar8;
  uint local_14;
  
  local_30 = 0.0;
  if (*(int *)(in_RDI + 0xcc) == 0) {
    in_stack_ffffffffffffffd4 = (in_RCX->l).multi.label;
    in_stack_ffffffffffffffd8 = (in_RCX->l).multi.weight;
    local_30 = (in_RCX->pred).scalar;
  }
  else {
    local_50 = (in_RCX->l).multi;
    local_48 = (in_RCX->l).cs.costs._end;
    local_40 = (in_RCX->l).cs.costs.end_array;
    in_stack_ffffffffffffffc8 = (example *)(in_RCX->l).cs.costs.erase_count;
    in_stack_ffffffffffffff90 = (in_RCX->pred).a_s._begin;
    in_stack_ffffffffffffff98 = (memory_tree *)(in_RCX->pred).a_s._end;
    local_60 = (in_RCX->pred).scalars.end_array;
    local_58 = (in_RCX->pred).scalars.erase_count;
  }
  uVar7 = 0x7f7fffff;
  cn_00 = 0;
  (in_RCX->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (in_RCX->l).simple.initial = 0.0;
  local_14 = in_EDX;
  while (pnVar3 = v_array<memory_tree_ns::node>::operator[]
                            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_14),
        pnVar3->internal != -1) {
    in_stack_ffffffffffffff50 = in_RSI;
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_14);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff80 = (in_RCX->pred).scalar;
    if (0.0 <= in_stack_ffffffffffffff80) {
      pnVar3 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_14);
      in_stack_ffffffffffffff4c = pnVar3->right;
      local_14 = in_stack_ffffffffffffff4c;
    }
    else {
      pnVar3 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_14);
      in_stack_ffffffffffffff4c = pnVar3->left;
      local_14 = in_stack_ffffffffffffff4c;
    }
  }
  if (*(int *)(in_RDI + 0xcc) == 0) {
    lVar2.weight = in_stack_ffffffffffffffd8;
    lVar2.label = in_stack_ffffffffffffffd4;
    (in_RCX->l).multi = lVar2;
    (in_RCX->pred).scalar = local_30;
  }
  else {
    (in_RCX->pred).a_s._begin = in_stack_ffffffffffffff90;
    (in_RCX->pred).a_s._end = (action_score *)in_stack_ffffffffffffff98;
    (in_RCX->pred).scalars.end_array = local_60;
    (in_RCX->pred).scalars.erase_count = local_58;
    (in_RCX->l).multi = local_50;
    (in_RCX->l).cs.costs._end = local_48;
    (in_RCX->l).cs.costs.end_array = local_40;
    (in_RCX->l).cs.costs.erase_count = (size_t)in_stack_ffffffffffffffc8;
  }
  fVar6 = 0.0;
  ec1 = (example *)
        pick_nearest(in_stack_ffffffffffffff98,(single_learner *)in_stack_ffffffffffffff90,cn_00,
                     (example *)CONCAT44(uVar7,in_stack_ffffffffffffff80));
  if (*(int *)(in_RDI + 0xcc) == 0) {
    if ((ec1 != (example *)0xffffffffffffffff) &&
       (ppeVar4 = v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(size_t)ec1),
       ((*ppeVar4)->l).multi.label == (in_RCX->l).multi.label)) {
      fVar6 = 1.0;
    }
  }
  else if (ec1 != (example *)0xffffffffffffffff) {
    peVar8 = in_RCX;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(size_t)ec1);
    fVar6 = F1_score_for_two_examples(ec1,(example *)CONCAT44(fVar6,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff40 = in_RCX;
    in_RCX = peVar8;
  }
  *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  peVar8 = in_RCX;
  if ((*(int *)(in_RDI + 0xac) == 1) && (ec1 != (example *)0xffffffffffffffff)) {
    ec_00 = in_RCX;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(size_t)ec1);
    fVar5 = normalized_linear_prod
                      (in_stack_ffffffffffffff50,
                       (example *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff40);
    peVar8 = ec_00;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(size_t)ec1);
    diag_kronecker_product_test
              ((example *)CONCAT44(uVar7,in_stack_ffffffffffffff80),ec1,
               (example *)CONCAT44(fVar6,fVar5),in_stack_ffffffffffffff6c);
    lVar1 = *(long *)(in_RDI + 0xe0);
    *(ulong *)(lVar1 + 0x6828) = CONCAT44(0x3f800000,fVar6);
    *(float *)(lVar1 + 0x6830) = -fVar5;
    *(undefined4 *)(*(long *)(in_RDI + 0xe0) + 0x6870) = in_XMM0_Da;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_stack_ffffffffffffff40,ec_00,(size_t)in_RCX);
  }
  if (*(int *)(in_RDI + 0xcc) == 1) {
    train_one_against_some_at_leaf
              ((memory_tree *)peVar8,
               (single_learner *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  return fVar6;
}

Assistant:

float return_reward_from_node(memory_tree& b, single_learner& base, uint32_t cn, example& ec, float weight = 1.f){
        //example& ec = *b.examples[ec_array_index];
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas ==false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }
	ec.l.simple = {FLT_MAX, 1., 0.0};
        while(b.nodes[cn].internal != -1){
            base.predict(ec, b.nodes[cn].base_router);
            float prediction = ec.pred.scalar;
            cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //get to leaf now:
	    int64_t closest_ec = 0;
        float reward = 0.f;
        closest_ec = pick_nearest(b, base, cn, ec); //no randomness for picking example.
        if (b.oas == false){
            if ((closest_ec != -1) && (b.examples[closest_ec]->l.multi.label == ec.l.multi.label))
                reward = 1.f;
        }
        else{
            if (closest_ec != -1)
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
        }
        b.total_num_queries++;

        if (b.learn_at_leaf == true && closest_ec != -1){
        	float score = normalized_linear_prod(b, &ec, b.examples[closest_ec]);
            diag_kronecker_product_test(ec, *b.examples[closest_ec], *b.kprod_ec, b.oas );
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight;
            base.learn(*b.kprod_ec, b.max_routers);
        }

        if (b.oas == true)
            train_one_against_some_at_leaf(b,base, cn,ec); ///learn the inference procedure anyway

        return reward;
    }